

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# expr.cc
# Opt level: O1

bool __thiscall
(anonymous_namespace)::ExprComparator::
VisitVarArg<mp::BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,(mp::expr::Kind)47>,(mp::expr::Kind)42,(mp::expr::Kind)45>>
          (ExprComparator *this,
          BasicIteratedExpr<mp::BasicExpr<(mp::expr::Kind)1,_(mp::expr::Kind)47>,_(mp::expr::Kind)42,_(mp::expr::Kind)45>
          e)

{
  int iVar1;
  int iVar2;
  bool bVar3;
  long lVar4;
  int *piVar5;
  long lVar6;
  
  piVar5 = (int *)0x0;
  if (**(int **)(this + 8) - 0x2aU < 4) {
    piVar5 = *(int **)(this + 8);
  }
  iVar1 = piVar5[1];
  lVar6 = (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.impl_ + 8;
  iVar2 = *(int *)((long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                         impl_ + 4);
  if ((long)iVar1 != 0) {
    lVar4 = 0;
    do {
      if (((long)iVar2 * 8 - lVar4 == 0) ||
         (bVar3 = mp::Equal((Expr)((ExprBase *)((long)piVar5 + lVar4 + 8))->impl_,
                            (Expr)((ExprBase *)(lVar6 + lVar4))->impl_), !bVar3)) {
        return false;
      }
      lVar4 = lVar4 + 8;
    } while ((long)iVar1 * 8 != lVar4);
    lVar6 = lVar6 + lVar4;
  }
  return lVar6 == (long)e.super_BasicExpr<(mp::expr::Kind)42,_(mp::expr::Kind)45>.super_ExprBase.
                        impl_ + (long)iVar2 * 8 + 8;
}

Assistant:

bool ExprComparator::VisitVarArg(E e) {
  E vararg = Cast<E>(expr_);
  typename E::iterator i = vararg.begin(), iend = vararg.end();
  typename E::iterator j = e.begin(), jend = e.end();
  for (; i != iend; ++i, ++j) {
    if (j == jend || !Equal(*i, *j))
      return false;
  }
  return j == jend;
}